

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O3

REF_STATUS
ref_recon_local_immediate_cloud
          (REF_CLOUD *one_layer,REF_NODE ref_node,REF_CELL ref_cell,REF_DBL *scalar)

{
  int iVar1;
  REF_DBL *pRVar2;
  REF_ADJ_ITEM pRVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  REF_ADJ pRVar7;
  long lVar8;
  long global;
  long lVar9;
  long lVar10;
  REF_DBL xyzs [4];
  REF_DBL local_58;
  REF_DBL local_50;
  REF_DBL local_48;
  REF_DBL local_40;
  
  iVar4 = ref_node->max;
  if (0 < iVar4) {
    lVar10 = 0;
    do {
      if ((((-1 < ref_node->global[lVar10]) && (ref_node->ref_mpi->id == ref_node->part[lVar10])) &&
          (pRVar7 = ref_cell->ref_adj, lVar10 < pRVar7->nnode)) &&
         (lVar8 = (long)pRVar7->first[lVar10], lVar8 != -1)) {
        pRVar3 = pRVar7->item + lVar8;
        iVar4 = ref_cell->node_per;
        while( true ) {
          if (0 < iVar4) {
            iVar1 = pRVar3->ref;
            lVar9 = 0;
            do {
              lVar6 = (long)ref_cell->c2n[(long)ref_cell->size_per * (long)iVar1 + lVar9];
              global = -1;
              if (((-1 < lVar6) &&
                  (ref_cell->c2n[(long)ref_cell->size_per * (long)iVar1 + lVar9] < ref_node->max))
                 && (global = ref_node->global[lVar6], global < 0)) {
                global = -1;
              }
              pRVar2 = ref_node->real;
              local_58 = pRVar2[lVar6 * 0xf];
              local_50 = pRVar2[lVar6 * 0xf + 1];
              local_48 = pRVar2[lVar6 * 0xf + 2];
              local_40 = scalar[lVar6];
              uVar5 = ref_cloud_store(one_layer[lVar10],global,&local_58);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,0x2e5,"ref_recon_local_immediate_cloud",(ulong)uVar5,"store could stencil");
                return uVar5;
              }
              iVar4 = ref_cell->node_per;
              lVar9 = lVar9 + 1;
            } while ((int)lVar9 < iVar4);
            pRVar7 = ref_cell->ref_adj;
          }
          lVar8 = (long)pRVar7->item[(int)lVar8].next;
          if (lVar8 == -1) break;
          pRVar3 = pRVar7->item + lVar8;
        }
        iVar4 = ref_node->max;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < iVar4);
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_recon_local_immediate_cloud(REF_CLOUD *one_layer,
                                                          REF_NODE ref_node,
                                                          REF_CELL ref_cell,
                                                          REF_DBL *scalar) {
  REF_INT node, item, cell, cell_node, target;
  REF_GLOB global;
  REF_DBL xyzs[4];
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      each_ref_cell_having_node(ref_cell, node, item, cell) {
        each_ref_cell_cell_node(ref_cell, cell_node) {
          target = ref_cell_c2n(ref_cell, cell_node, cell);
          global = ref_node_global(ref_node, target);
          xyzs[0] = ref_node_xyz(ref_node, 0, target);
          xyzs[1] = ref_node_xyz(ref_node, 1, target);
          xyzs[2] = ref_node_xyz(ref_node, 2, target);
          xyzs[3] = scalar[target];
          RSS(ref_cloud_store(one_layer[node], global, xyzs),
              "store could stencil");
        }
      }
    }
  }
  return REF_SUCCESS;
}